

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Location * __thiscall
wabt::anon_unknown_15::BinaryReaderIR::GetLocation
          (Location *__return_storage_ptr__,BinaryReaderIR *this)

{
  char *__s;
  size_t sVar1;
  
  (__return_storage_ptr__->field_1).field_0.last_column = 0;
  __s = this->filename_;
  sVar1 = strlen(__s);
  (__return_storage_ptr__->filename)._M_len = sVar1;
  (__return_storage_ptr__->filename)._M_str = __s;
  (__return_storage_ptr__->field_1).field_1.offset =
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  return __return_storage_ptr__;
}

Assistant:

Location BinaryReaderIR::GetLocation() const {
  Location loc;
  loc.filename = filename_;
  loc.offset = state->offset;
  return loc;
}